

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  LogMessage *other;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  undefined8 *puVar4;
  undefined1 *puVar5;
  Arena *pAVar6;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x7fc);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(from->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(from->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(from->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(from->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(from->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::MergeFrom(&this->public_dependency_,&from->public_dependency_);
  RepeatedField<int>::MergeFrom(&this->weak_dependency_,&from->weak_dependency_);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->name_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->name_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 2) != 0) {
      pvVar2 = (from->package_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->package_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 4) != 0) {
      pvVar2 = (from->syntax_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->syntax_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      this_00 = this->options_;
      if (this_00 == (FileOptions *)0x0) {
        uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        pAVar6 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar6 = *(Arena **)pAVar6;
        }
        this_00 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(pAVar6);
        this->options_ = this_00;
      }
      puVar5 = (undefined1 *)from->options_;
      if ((FileOptions *)puVar5 == (FileOptions *)0x0) {
        puVar5 = _FileOptions_default_instance_;
      }
      FileOptions::MergeFrom(this_00,(FileOptions *)puVar5);
    }
    if ((uVar1 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      this_01 = this->source_code_info_;
      if (this_01 == (SourceCodeInfo *)0x0) {
        uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        pAVar6 = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          pAVar6 = *(Arena **)pAVar6;
        }
        this_01 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(pAVar6);
        this->source_code_info_ = this_01;
      }
      puVar5 = (undefined1 *)from->source_code_info_;
      if ((SourceCodeInfo *)puVar5 == (SourceCodeInfo *)0x0) {
        puVar5 = _SourceCodeInfo_default_instance_;
      }
      SourceCodeInfo::MergeFrom(this_01,(SourceCodeInfo *)puVar5);
    }
  }
  uVar3 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_package(from._internal_package());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_syntax(from._internal_syntax());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->::PROTOBUF_NAMESPACE_ID::FileOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_mutable_source_code_info()->::PROTOBUF_NAMESPACE_ID::SourceCodeInfo::MergeFrom(from._internal_source_code_info());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}